

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfadop.h
# Opt level: O2

value_type __thiscall
TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>::dx
          (TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
           *this,int i)

{
  double dVar1;
  value_type vVar2;
  
  dVar1 = this->left_->dx_[i];
  vVar2 = TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>::dx(&this->right_->fadexpr_,i);
  return vVar2 + dVar1;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}